

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsPopupOpen(char *str_id,ImGuiPopupFlags popup_flags)

{
  bool bVar1;
  uint in_ESI;
  char *in_RDI;
  ImGuiWindow *unaff_retaddr;
  ImGuiID id;
  ImGuiContext *g;
  ImGuiContext *pIVar2;
  ImGuiID in_stack_fffffffffffffff0;
  
  pIVar2 = GImGui;
  if ((in_ESI & 0x80) == 0) {
    ImGuiWindow::GetID(unaff_retaddr,in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  bVar1 = IsPopupOpen(in_stack_fffffffffffffff0,(ImGuiPopupFlags)((ulong)pIVar2 >> 0x20));
  return bVar1;
}

Assistant:

bool ImGui::IsPopupOpen(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiID id = (popup_flags & ImGuiPopupFlags_AnyPopupId) ? 0 : g.CurrentWindow->GetID(str_id);
    if ((popup_flags & ImGuiPopupFlags_AnyPopupLevel) && id != 0)
        IM_ASSERT(0 && "Cannot use IsPopupOpen() with a string id and ImGuiPopupFlags_AnyPopupLevel."); // But non-string version is legal and used internally
    return IsPopupOpen(id, popup_flags);
}